

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall GroundScene::processSignal(GroundScene *this,SceneSignal *signal)

{
  SceneSignal *signal_local;
  GroundScene *this_local;
  
  if (signal->type == 1) {
    genPlant(this,this->selectX,this->selectY,signal->data);
  }
  else if ((signal->type == 2) && (this->plants[this->selectY][this->selectX] != (Plant *)0x0)) {
    (*(this->plants[this->selectY][this->selectX]->super_Charactor).super_Object._vptr_Object[6])();
    this->plants[this->selectY][this->selectX] = (Plant *)0x0;
  }
  return;
}

Assistant:

void GroundScene::processSignal(SceneSignal& signal){
	if(signal.type == SS_SIGNAL_GEN_PLANT){
		genPlant(selectX, selectY, signal.data);
	}
	else if(signal.type == SS_SIGNAL_REMOVE_PLANT){
		if(plants[selectY][selectX]){
			plants[selectY][selectX]->die();
			plants[selectY][selectX] = NULL;
		}
	}
}